

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::Codec(Codec *this)

{
  Codec *this_local;
  
  this->_block_bytes = 0;
  this->_block_count = 0;
  this->_block_next_prime = 0;
  this->_seed_override = false;
  this->_dense_count = 0;
  this->_p_seed = 0;
  this->_d_seed = 0;
  this->_extra_count = 0;
  this->_row_count = 0;
  this->_mix_count = 0;
  this->_mix_next_prime = 0;
  this->_recovery_blocks = (uint8_t *)0x0;
  this->_recovery_rows = 0;
  this->_input_blocks = (uint8_t *)0x0;
  this->_input_final_bytes = 0;
  this->_output_final_bytes = 0;
  this->_input_allocated = 0;
  this->_all_original = false;
  this->_copied_original = (uint8_t *)0x0;
  this->_original_out_of_order = false;
  this->_peel_rows = (PeelRow *)0x0;
  this->_peel_cols = (PeelColumn *)0x0;
  this->_peel_col_refs = (PeelRefs *)0x0;
  this->_peel_tail_rows = (PeelRow *)0x0;
  this->_workspace_allocated = 0;
  this->_peel_head_rows = 0;
  this->_defer_head_columns = 0;
  this->_defer_head_rows = 0;
  this->_defer_count = 0;
  this->_compress_matrix = (uint64_t *)0x0;
  this->_ge_matrix = (uint64_t *)0x0;
  this->_ge_allocated = 0;
  this->_ge_pitch = 0;
  this->_ge_rows = 0;
  this->_ge_cols = 0;
  this->_pivots = (uint16_t *)0x0;
  this->_pivot_count = 0;
  this->_ge_col_map = (uint16_t *)0x0;
  this->_ge_row_map = (uint16_t *)0x0;
  this->_next_pivot = 0;
  this->_heavy_matrix = (uint8_t *)0x0;
  this->_heavy_pitch = 0;
  this->_heavy_columns = 0;
  this->_heavy_rows = 0;
  this->_first_heavy_column = 0;
  this->_first_heavy_pivot = 0;
  return;
}

Assistant:

Codec::Codec()
{
}